

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::intersectsPolygon(Earcut<unsigned_int> *this,Node *a,Node *b)

{
  uint uVar1;
  bool bVar2;
  Node *p1;
  
  p1 = a;
  do {
    if (p1->i != a->i) {
      uVar1 = p1->next->i;
      if (((uVar1 != a->i) && (uVar1 != b->i && p1->i != b->i)) &&
         (bVar2 = intersects(this,p1,p1->next,a,b), bVar2)) {
        return true;
      }
    }
    p1 = p1->next;
    if (p1 == a) {
      return false;
    }
  } while( true );
}

Assistant:

bool Earcut<N>::intersectsPolygon(const Node* a, const Node* b) {
    const Node* p = a;
    do {
        if (p->i != a->i && p->next->i != a->i && p->i != b->i && p->next->i != b->i &&
                intersects(p, p->next, a, b)) return true;
        p = p->next;
    } while (p != a);

    return false;
}